

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defineCallOpen.hh
# Opt level: O2

shared_ptr<discordpp::BotStruct::Call> __thiscall discordpp::BotStruct::Call::run(Call *this)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<discordpp::BotStruct::RenderedCall> sVar2;
  shared_ptr<discordpp::BotStruct::Call> sVar3;
  
  plVar1 = *(long **)(in_RSI + 0x18);
  sVar2 = render((Call *)&stack0xffffffffffffffd0);
  (**(code **)(*plVar1 + 0x38))
            (plVar1,(Call *)&stack0xffffffffffffffd0,
             sVar2.
             super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  std::__shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<discordpp::BotStruct::Call,void>
            ((__shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  sVar3.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<discordpp::BotStruct::Call>)
         sVar3.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto run() {
        bot_->doCall(render());
        return shared_from_this();
    }